

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O2

bool ShaderParserParseRenderPass
               (string *prev_line,string *line,uint32_t current_char,uint32_t line_number,
               FErrorReport *report_error,RenderPass *pass)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  uint32_t height;
  uint32_t width;
  allocator<char> local_105;
  uint32_t local_104;
  FErrorReport *local_100;
  string args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char input [64];
  char output [64];
  
  input[0x30] = '\0';
  input[0x31] = '\0';
  input[0x32] = '\0';
  input[0x33] = '\0';
  input[0x34] = '\0';
  input[0x35] = '\0';
  input[0x36] = '\0';
  input[0x37] = '\0';
  input[0x38] = '\0';
  input[0x39] = '\0';
  input[0x3a] = '\0';
  input[0x3b] = '\0';
  input[0x3c] = '\0';
  input[0x3d] = '\0';
  input[0x3e] = '\0';
  input[0x3f] = '\0';
  input[0x20] = '\0';
  input[0x21] = '\0';
  input[0x22] = '\0';
  input[0x23] = '\0';
  input[0x24] = '\0';
  input[0x25] = '\0';
  input[0x26] = '\0';
  input[0x27] = '\0';
  input[0x28] = '\0';
  input[0x29] = '\0';
  input[0x2a] = '\0';
  input[0x2b] = '\0';
  input[0x2c] = '\0';
  input[0x2d] = '\0';
  input[0x2e] = '\0';
  input[0x2f] = '\0';
  input[0x10] = '\0';
  input[0x11] = '\0';
  input[0x12] = '\0';
  input[0x13] = '\0';
  input[0x14] = '\0';
  input[0x15] = '\0';
  input[0x16] = '\0';
  input[0x17] = '\0';
  input[0x18] = '\0';
  input[0x19] = '\0';
  input[0x1a] = '\0';
  input[0x1b] = '\0';
  input[0x1c] = '\0';
  input[0x1d] = '\0';
  input[0x1e] = '\0';
  input[0x1f] = '\0';
  input[0] = '\0';
  input[1] = '\0';
  input[2] = '\0';
  input[3] = '\0';
  input[4] = '\0';
  input[5] = '\0';
  input[6] = '\0';
  input[7] = '\0';
  input[8] = '\0';
  input[9] = '\0';
  input[10] = '\0';
  input[0xb] = '\0';
  input[0xc] = '\0';
  input[0xd] = '\0';
  input[0xe] = '\0';
  input[0xf] = '\0';
  output[0x30] = '\0';
  output[0x31] = '\0';
  output[0x32] = '\0';
  output[0x33] = '\0';
  output[0x34] = '\0';
  output[0x35] = '\0';
  output[0x36] = '\0';
  output[0x37] = '\0';
  output[0x38] = '\0';
  output[0x39] = '\0';
  output[0x3a] = '\0';
  output[0x3b] = '\0';
  output[0x3c] = '\0';
  output[0x3d] = '\0';
  output[0x3e] = '\0';
  output[0x3f] = '\0';
  output[0x20] = '\0';
  output[0x21] = '\0';
  output[0x22] = '\0';
  output[0x23] = '\0';
  output[0x24] = '\0';
  output[0x25] = '\0';
  output[0x26] = '\0';
  output[0x27] = '\0';
  output[0x28] = '\0';
  output[0x29] = '\0';
  output[0x2a] = '\0';
  output[0x2b] = '\0';
  output[0x2c] = '\0';
  output[0x2d] = '\0';
  output[0x2e] = '\0';
  output[0x2f] = '\0';
  output[0x10] = '\0';
  output[0x11] = '\0';
  output[0x12] = '\0';
  output[0x13] = '\0';
  output[0x14] = '\0';
  output[0x15] = '\0';
  output[0x16] = '\0';
  output[0x17] = '\0';
  output[0x18] = '\0';
  output[0x19] = '\0';
  output[0x1a] = '\0';
  output[0x1b] = '\0';
  output[0x1c] = '\0';
  output[0x1d] = '\0';
  output[0x1e] = '\0';
  output[0x1f] = '\0';
  output[0] = '\0';
  output[1] = '\0';
  output[2] = '\0';
  output[3] = '\0';
  output[4] = '\0';
  output[5] = '\0';
  output[6] = '\0';
  output[7] = '\0';
  output[8] = '\0';
  output[9] = '\0';
  output[10] = '\0';
  output[0xb] = '\0';
  output[0xc] = '\0';
  output[0xd] = '\0';
  output[0xe] = '\0';
  output[0xf] = '\0';
  width = 0;
  height = 0;
  local_104 = line_number;
  local_100 = report_error;
  std::__cxx11::string::substr((ulong)&args,(ulong)prev_line);
  iVar2 = __isoc99_sscanf(args._M_dataplus._M_p,"(%[^,], %[^,], %d, %d)",output,input,&width,&height
                         );
  if (iVar2 != 4) {
    height = 0;
    width = 0;
    input[0] = '\0';
    input[1] = '\0';
    input[2] = '\0';
    input[3] = '\0';
    input[4] = '\0';
    input[5] = '\0';
    input[6] = '\0';
    input[7] = '\0';
    input[8] = '\0';
    input[9] = '\0';
    input[10] = '\0';
    input[0xb] = '\0';
    input[0xc] = '\0';
    input[0xd] = '\0';
    input[0xe] = '\0';
    input[0xf] = '\0';
    input[0x10] = '\0';
    input[0x11] = '\0';
    input[0x12] = '\0';
    input[0x13] = '\0';
    input[0x14] = '\0';
    input[0x15] = '\0';
    input[0x16] = '\0';
    input[0x17] = '\0';
    input[0x18] = '\0';
    input[0x19] = '\0';
    input[0x1a] = '\0';
    input[0x1b] = '\0';
    input[0x1c] = '\0';
    input[0x1d] = '\0';
    input[0x1e] = '\0';
    input[0x1f] = '\0';
    input[0x20] = '\0';
    input[0x21] = '\0';
    input[0x22] = '\0';
    input[0x23] = '\0';
    input[0x24] = '\0';
    input[0x25] = '\0';
    input[0x26] = '\0';
    input[0x27] = '\0';
    input[0x28] = '\0';
    input[0x29] = '\0';
    input[0x2a] = '\0';
    input[0x2b] = '\0';
    input[0x2c] = '\0';
    input[0x2d] = '\0';
    input[0x2e] = '\0';
    input[0x2f] = '\0';
    input[0x30] = '\0';
    input[0x31] = '\0';
    input[0x32] = '\0';
    input[0x33] = '\0';
    input[0x34] = '\0';
    input[0x35] = '\0';
    input[0x36] = '\0';
    input[0x37] = '\0';
    input[0x38] = '\0';
    input[0x39] = '\0';
    input[0x3a] = '\0';
    input[0x3b] = '\0';
    input[0x3c] = '\0';
    input[0x3d] = '\0';
    input[0x3e] = '\0';
    input[0x3f] = '\0';
    output[0] = '\0';
    output[1] = '\0';
    output[2] = '\0';
    output[3] = '\0';
    output[4] = '\0';
    output[5] = '\0';
    output[6] = '\0';
    output[7] = '\0';
    output[8] = '\0';
    output[9] = '\0';
    output[10] = '\0';
    output[0xb] = '\0';
    output[0xc] = '\0';
    output[0xd] = '\0';
    output[0xe] = '\0';
    output[0xf] = '\0';
    output[0x10] = '\0';
    output[0x11] = '\0';
    output[0x12] = '\0';
    output[0x13] = '\0';
    output[0x14] = '\0';
    output[0x15] = '\0';
    output[0x16] = '\0';
    output[0x17] = '\0';
    output[0x18] = '\0';
    output[0x19] = '\0';
    output[0x1a] = '\0';
    output[0x1b] = '\0';
    output[0x1c] = '\0';
    output[0x1d] = '\0';
    output[0x1e] = '\0';
    output[0x1f] = '\0';
    output[0x20] = '\0';
    output[0x21] = '\0';
    output[0x22] = '\0';
    output[0x23] = '\0';
    output[0x24] = '\0';
    output[0x25] = '\0';
    output[0x26] = '\0';
    output[0x27] = '\0';
    output[0x28] = '\0';
    output[0x29] = '\0';
    output[0x2a] = '\0';
    output[0x2b] = '\0';
    output[0x2c] = '\0';
    output[0x2d] = '\0';
    output[0x2e] = '\0';
    output[0x2f] = '\0';
    output[0x30] = '\0';
    output[0x31] = '\0';
    output[0x32] = '\0';
    output[0x33] = '\0';
    output[0x34] = '\0';
    output[0x35] = '\0';
    output[0x36] = '\0';
    output[0x37] = '\0';
    output[0x38] = '\0';
    output[0x39] = '\0';
    output[0x3a] = '\0';
    output[0x3b] = '\0';
    output[0x3c] = '\0';
    output[0x3d] = '\0';
    output[0x3e] = '\0';
    output[0x3f] = '\0';
    iVar2 = __isoc99_sscanf(args._M_dataplus._M_p,"(%[^,], %d, %d)");
    if (iVar2 != 3) {
      height = 0;
      width = 0;
      input[0] = '\0';
      input[1] = '\0';
      input[2] = '\0';
      input[3] = '\0';
      input[4] = '\0';
      input[5] = '\0';
      input[6] = '\0';
      input[7] = '\0';
      input[8] = '\0';
      input[9] = '\0';
      input[10] = '\0';
      input[0xb] = '\0';
      input[0xc] = '\0';
      input[0xd] = '\0';
      input[0xe] = '\0';
      input[0xf] = '\0';
      input[0x10] = '\0';
      input[0x11] = '\0';
      input[0x12] = '\0';
      input[0x13] = '\0';
      input[0x14] = '\0';
      input[0x15] = '\0';
      input[0x16] = '\0';
      input[0x17] = '\0';
      input[0x18] = '\0';
      input[0x19] = '\0';
      input[0x1a] = '\0';
      input[0x1b] = '\0';
      input[0x1c] = '\0';
      input[0x1d] = '\0';
      input[0x1e] = '\0';
      input[0x1f] = '\0';
      input[0x20] = '\0';
      input[0x21] = '\0';
      input[0x22] = '\0';
      input[0x23] = '\0';
      input[0x24] = '\0';
      input[0x25] = '\0';
      input[0x26] = '\0';
      input[0x27] = '\0';
      input[0x28] = '\0';
      input[0x29] = '\0';
      input[0x2a] = '\0';
      input[0x2b] = '\0';
      input[0x2c] = '\0';
      input[0x2d] = '\0';
      input[0x2e] = '\0';
      input[0x2f] = '\0';
      input[0x30] = '\0';
      input[0x31] = '\0';
      input[0x32] = '\0';
      input[0x33] = '\0';
      input[0x34] = '\0';
      input[0x35] = '\0';
      input[0x36] = '\0';
      input[0x37] = '\0';
      input[0x38] = '\0';
      input[0x39] = '\0';
      input[0x3a] = '\0';
      input[0x3b] = '\0';
      input[0x3c] = '\0';
      input[0x3d] = '\0';
      input[0x3e] = '\0';
      input[0x3f] = '\0';
      output[0] = '\0';
      output[1] = '\0';
      output[2] = '\0';
      output[3] = '\0';
      output[4] = '\0';
      output[5] = '\0';
      output[6] = '\0';
      output[7] = '\0';
      output[8] = '\0';
      output[9] = '\0';
      output[10] = '\0';
      output[0xb] = '\0';
      output[0xc] = '\0';
      output[0xd] = '\0';
      output[0xe] = '\0';
      output[0xf] = '\0';
      output[0x10] = '\0';
      output[0x11] = '\0';
      output[0x12] = '\0';
      output[0x13] = '\0';
      output[0x14] = '\0';
      output[0x15] = '\0';
      output[0x16] = '\0';
      output[0x17] = '\0';
      output[0x18] = '\0';
      output[0x19] = '\0';
      output[0x1a] = '\0';
      output[0x1b] = '\0';
      output[0x1c] = '\0';
      output[0x1d] = '\0';
      output[0x1e] = '\0';
      output[0x1f] = '\0';
      output[0x20] = '\0';
      output[0x21] = '\0';
      output[0x22] = '\0';
      output[0x23] = '\0';
      output[0x24] = '\0';
      output[0x25] = '\0';
      output[0x26] = '\0';
      output[0x27] = '\0';
      output[0x28] = '\0';
      output[0x29] = '\0';
      output[0x2a] = '\0';
      output[0x2b] = '\0';
      output[0x2c] = '\0';
      output[0x2d] = '\0';
      output[0x2e] = '\0';
      output[0x2f] = '\0';
      output[0x30] = '\0';
      output[0x31] = '\0';
      output[0x32] = '\0';
      output[0x33] = '\0';
      output[0x34] = '\0';
      output[0x35] = '\0';
      output[0x36] = '\0';
      output[0x37] = '\0';
      output[0x38] = '\0';
      output[0x39] = '\0';
      output[0x3a] = '\0';
      output[0x3b] = '\0';
      output[0x3c] = '\0';
      output[0x3d] = '\0';
      output[0x3e] = '\0';
      output[0x3f] = '\0';
      iVar2 = __isoc99_sscanf(args._M_dataplus._M_p,"(%[^,], %[^)])");
      if (iVar2 != 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,
                   "Render pass format should be @pass(output, input, width, height), @pass(output, input) or @pass(output, width, height)"
                   ,&local_105);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
        ::operator()(local_100,&local_d8,local_104);
        std::__cxx11::string::~string((string *)&local_d8);
        bVar3 = false;
        goto LAB_0011fe0b;
      }
    }
  }
  std::__cxx11::string::assign((char *)&pass->Input);
  std::__cxx11::string::assign((char *)&pass->Output);
  pass->Width = width;
  pass->Height = height;
  bVar1 = std::operator==(&pass->Output,"main");
  bVar3 = true;
  if (bVar1) {
    pass->IsMain = true;
  }
LAB_0011fe0b:
  std::__cxx11::string::~string((string *)&args);
  return bVar3;
}

Assistant:

bool ShaderParserParseRenderPass(const std::string& prev_line, const std::string& line, uint32_t current_char, uint32_t line_number, FErrorReport report_error, RenderPass& pass) {
    char input[64] = {0};
    char output[64] = {0};

    uint32_t width = 0;
    uint32_t height = 0;

    std::string args = prev_line.substr(current_char + 5, std::string::npos);

    int scanned = sscanf(args.c_str(), "(%[^,], %[^,], %d, %d)", output, input, &width, &height);
    if (scanned != 4) {
        width = height = 0;

        memset(input, 0x0, sizeof(input));
        memset(output, 0x0, sizeof(output));

        scanned = sscanf(args.c_str(), "(%[^,], %d, %d)", output, &width, &height);

        if (scanned != 3) {
            width = height = 0;

            memset(input, 0x0, sizeof(input));
            memset(output, 0x0, sizeof(output));

            scanned = sscanf(args.c_str(), "(%[^,], %[^)])", output, input);

            if (scanned != 2) {
                report_error("Render pass format should be @pass(output, input, width, height), @pass(output, input) or @pass(output, width, height)", line_number);
                return false;
            }
        }
    }

    pass.Input = input;
    pass.Output = output;
    pass.Width = width;
    pass.Height = height;

    if (pass.Output == "main") {
        pass.IsMain = true;
    }

    return true;
}